

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void * region_reserve_slow(region *region,size_t size)

{
  uint32_t uVar1;
  size_t sVar2;
  rslab *slab_00;
  rlist *prVar3;
  rslab *slab;
  size_t slab_min_size;
  size_t size_local;
  region *region_local;
  
  uVar1 = rslab_sizeof();
  sVar2 = slab_sizeof();
  slab_00 = (rslab *)slab_get(region->cache,(size + uVar1) - sVar2);
  if (slab_00 == (rslab *)0x0) {
    region_local = (region *)0x0;
  }
  else {
    slab_00->used = 0;
    prVar3 = &(slab_00->slab).next_in_list;
    prVar3->prev = &(region->slabs).slabs;
    (slab_00->slab).next_in_list.next = (region->slabs).slabs.next;
    prVar3->prev->next = prVar3;
    ((slab_00->slab).next_in_list.next)->prev = prVar3;
    (region->slabs).stats.total = (slab_00->slab).size + (region->slabs).stats.total;
    region_local = (region *)rslab_data(slab_00);
  }
  return region_local;
}

Assistant:

void *
region_reserve_slow(struct region *region, size_t size)
{
	/* The new slab must have at least this many bytes available. */
	size_t slab_min_size = size + rslab_sizeof() - slab_sizeof();

	struct rslab *slab;
	slab = (struct rslab *) slab_get(region->cache, slab_min_size);
	if (slab == NULL)
		return NULL;
	slab->used = 0;
	/*
	 * Sic: add the new slab to the beginning of the
	 * region, even if it is full, otherwise,
	 * region_truncate() won't work.
	 */
	slab_list_add(&region->slabs, &slab->slab, next_in_list);
	VALGRIND_MALLOCLIKE_BLOCK(rslab_data(slab), rslab_unused(slab), 0, 0);
	return rslab_data(slab);
}